

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumparray.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  allocator aVar1;
  char *__s;
  long lVar2;
  char cVar3;
  long lVar4;
  char cVar5;
  ostream *poVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  string arrayName;
  string sourceFilename;
  string headerFilename;
  ofstream fout;
  ifstream fin;
  char buffer [2391];
  undefined1 auStack_df8 [8];
  char *local_df0;
  long local_de8;
  char local_de0 [16];
  char *local_dd0;
  long local_dc8;
  char local_dc0 [16];
  undefined1 *local_db0 [2];
  undefined1 local_da0 [16];
  long local_d90;
  filebuf local_d88 [8];
  undefined8 uStack_d80;
  uint auStack_d78 [50];
  char acStack_cb0 [24];
  ios_base local_c98 [264];
  long local_b90;
  long local_b88;
  byte abStack_b70 [488];
  allocator local_988 [2392];
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)&local_dd0,argv[1],local_988);
    std::__cxx11::string::string((string *)local_db0,argv[2],local_988);
    std::__cxx11::string::string((string *)&local_df0,argv[3],local_988);
    std::ifstream::ifstream(&local_b90,(string *)&local_dd0,_S_bin);
    std::ofstream::ofstream(&local_d90,(string *)local_db0,_S_out);
    if ((abStack_b70[*(long *)(local_b90 + -0x18)] & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_d90,"#include <cstddef>",0x12);
      std::ios::widen((char)(ostream *)&local_d90 + (char)*(undefined8 *)(local_d90 + -0x18));
      std::ostream::put((char)&local_d90);
      std::ostream::flush();
      std::ios::widen((char)&local_d90 + (char)*(undefined8 *)(local_d90 + -0x18));
      std::ostream::put((char)&local_d90);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_d90,"static const char ",0x12);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_d90,local_df0,local_de8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[] = {",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar10 = 0;
      do {
        std::istream::read((char *)&local_b90,(long)local_988);
        lVar4 = local_b88;
        cVar3 = (char)(ostream *)&local_d90;
        if (0 < local_b88) {
          lVar9 = 0;
          do {
            aVar1 = local_988[lVar9];
            uVar8 = (int)(char)aVar1 + 0x100;
            if (-1 < (char)aVar1) {
              uVar8 = (int)(char)aVar1;
            }
            if (0x7f < uVar8) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d90,"-",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d90,"0x",2);
            *(undefined8 *)((long)&uStack_d80 + *(long *)(local_d90 + -0x18)) = 2;
            lVar2 = *(long *)(local_d90 + -0x18);
            if (acStack_cb0[lVar2 + 1] == '\0') {
              cVar5 = std::ios::widen((char)auStack_df8 + (char)lVar2 + 'h');
              acStack_cb0[lVar2] = cVar5;
              acStack_cb0[lVar2 + 1] = '\x01';
            }
            acStack_cb0[lVar2] = '0';
            *(uint *)((long)auStack_d78 + *(long *)(local_d90 + -0x18)) =
                 *(uint *)((long)auStack_d78 + *(long *)(local_d90 + -0x18)) & 0xffffffb5 | 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_d90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            iVar10 = iVar10 + 1;
            if (iVar10 == 0x14) {
              std::ios::widen((char)*(undefined8 *)(local_d90 + -0x18) + cVar3);
              std::ostream::put(cVar3);
              iVar10 = 0;
              std::ostream::flush();
            }
            lVar9 = lVar9 + 1;
          } while (lVar4 != lVar9);
        }
      } while (0 < lVar4);
      if (0 < iVar10) {
        std::ios::widen(cVar3 + (char)*(undefined8 *)(local_d90 + -0x18));
        std::ostream::put((char)&local_d90);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d90,"};",2);
      std::ios::widen((char)(ostream *)&local_d90 + (char)*(undefined8 *)(local_d90 + -0x18));
      std::ostream::put((char)&local_d90);
      std::ostream::flush();
      std::ios::widen((char)&local_d90 + (char)*(undefined8 *)(local_d90 + -0x18));
      std::ostream::put((char)&local_d90);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_d90,"size_t ",7);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_d90,local_df0,local_de8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_length = sizeof(",0x11);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_df0,local_de8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") / sizeof(char);",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ifstream::close();
      std::ofstream::close();
      iVar10 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Can\'t open file ",0x10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_dd0,local_dc8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      iVar10 = 1;
      std::ostream::flush();
    }
    local_d90 = _VTT;
    *(undefined8 *)(local_d88 + *(long *)(_VTT + -0x18) + -8) = _operator_delete;
    std::filebuf::~filebuf(local_d88);
    std::ios_base::~ios_base(local_c98);
    std::ifstream::~ifstream(&local_b90);
    if (local_df0 != local_de0) {
      operator_delete(local_df0);
    }
    if (local_db0[0] != local_da0) {
      operator_delete(local_db0[0]);
    }
    if (local_dd0 != local_dc0) {
      operator_delete(local_dd0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1060d8);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," <sourceFile> <headerFile> <arrayName>",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " <sourceFile> <headerFile> <arrayName>" << std::endl;
        return 1;
    }

    std::string sourceFilename(argv[1]);
    std::string headerFilename(argv[2]);
    std::string arrayName(argv[3]);

    std::ifstream fin(sourceFilename, std::ios::binary);
    std::ofstream fout(headerFilename);

    if (!fin) {
        std::cerr << "Can't open file " << sourceFilename << "!" << std::endl;
        return 1;
    }

    // #include <cstddef>
    //
    // static const char <arrayName>[] = {
    //  /*... hexadecimal data from source file ...*/
    // };
    //
    // size_t <arrayName>_length = sizeof(<arrayName>) / sizeof(char);

    fout << "#include <cstddef>" << std::endl;
    fout << std::endl;
    fout << "static const char " << arrayName << "[] = {" << std::endl;

    char buffer[2391];
    const int maxBytesInLine = 120 / 6;
    int bytesInLine = 0;

    std::streamsize n;
    do {
        fin.read(buffer, sizeof(buffer) / sizeof(char));
        n = fin.gcount();
        for (std::streamsize i = 0; i < n; ++i) {
            unsigned int value = (unsigned int) buffer[i];
            if (value > 0xff) {
                value -= 0xffffff00;
            }
            if (value >= 128) {
                fout << "-";
                value = 256 - value;
            }
            fout << "0x" << std::setw(2) << std::setfill('0') << std::hex << value << ", ";
            ++bytesInLine;
            if (bytesInLine == maxBytesInLine) {
                fout << std::endl;
                bytesInLine = 0;
            }
        }
    } while (n > 0);

    if (bytesInLine > 0)
        fout << std::endl;

    fout << "};" << std::endl;
    fout << std::endl;
    fout << "size_t " << arrayName << "_length = sizeof(" << arrayName << ") / sizeof(char);" << std::endl;

    fin.close();
    fout.close();

    return 0;
}